

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgGeneratorState.cpp
# Opt level: O0

void __thiscall rsg::GeneratorState::~GeneratorState(GeneratorState *this)

{
  GeneratorState *this_local;
  
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_precedenceStack);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_exprFlagStack);
  NameAllocator::~NameAllocator(&this->m_nameAllocator);
  return;
}

Assistant:

GeneratorState::~GeneratorState (void)
{
}